

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_26d854::OSScapture::start(OSScapture *this)

{
  thread local_20;
  long *local_18;
  
  (this->mKillNow)._M_base._M_i = false;
  local_20._M_id._M_thread = (id)0;
  local_18 = (long *)::operator_new(0x20);
  *local_18 = (long)&PTR___State_001b0818;
  local_18[1] = (long)this;
  local_18[2] = (long)recordProc;
  local_18[3] = 0;
  std::thread::_M_start_thread(&local_20,&local_18,0);
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  if ((this->mThread)._M_id._M_thread == 0) {
    (this->mThread)._M_id._M_thread = (native_handle_type)local_20._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void OSScapture::start()
{
    try {
        mKillNow.store(false, std::memory_order_release);
        mThread = std::thread{std::mem_fn(&OSScapture::recordProc), this};
    }
    catch(std::exception& e) {
        throw al::backend_exception{ALC_INVALID_DEVICE, "Failed to start recording thread: %s",
            e.what()};
    }
}